

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode ReadContextModes(BrotliDecoderStateInternal *s)

{
  bool bVar1;
  BrotliBitReader *pBVar2;
  uint local_98;
  int local_94;
  uint32_t bits;
  int i;
  BrotliBitReader *br;
  BrotliDecoderStateInternal *s_local;
  
  pBVar2 = &s->br;
  local_94 = s->loop_counter;
  do {
    if ((int)s->num_block_types[0] <= local_94) {
      return BROTLI_DECODER_SUCCESS;
    }
    while (0x40 - (s->br).bit_pos_ < 2) {
      if ((s->br).avail_in == 0) {
        bVar1 = false;
        goto LAB_00106156;
      }
      pBVar2->val_ = pBVar2->val_ >> 8;
      pBVar2->val_ = (ulong)*(s->br).next_in << 0x38 | pBVar2->val_;
      (s->br).bit_pos_ = (s->br).bit_pos_ - 8;
      (s->br).avail_in = (s->br).avail_in - 1;
      (s->br).next_in = (s->br).next_in + 1;
    }
    local_98 = (uint)(pBVar2->val_ >> ((byte)(s->br).bit_pos_ & 0x3f)) & 3;
    (s->br).bit_pos_ = (s->br).bit_pos_ + 2;
    bVar1 = true;
LAB_00106156:
    if (!bVar1) {
      s->loop_counter = local_94;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    s->context_modes[local_94] = (uint8_t)(local_98 << 1);
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

static BrotliDecoderErrorCode ReadContextModes(BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  int i = s->loop_counter;

  while (i < (int)s->num_block_types[0]) {
    uint32_t bits;
    if (!BrotliSafeReadBits(br, 2, &bits)) {
      s->loop_counter = i;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    s->context_modes[i] = (uint8_t)(bits << 1);
    BROTLI_LOG_ARRAY_INDEX(s->context_modes, i);
    i++;
  }
  return BROTLI_DECODER_SUCCESS;
}